

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool Fossilize::pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (void *pNext,MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value,
               DynamicStateInfo *dynamic_state_info)

{
  VkStructureType VVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  VkPipelineLibraryCreateInfoKHR *create_info;
  VkImageLayout value_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar5;
  uint32_t i;
  ulong uVar6;
  long lVar7;
  VkPipeline *ppVVar8;
  StringRefType *name;
  Value *pVVar9;
  ulong uVar10;
  Value value_4;
  Value value_2;
  Value value;
  Value view_masks;
  Value locations;
  Value next;
  Value discardRectangles;
  Value extent;
  Value discardRectangle;
  char *local_a8;
  SizeType SStack_a0;
  undefined4 uStack_9c;
  Number *local_90;
  Value nexts;
  string local_70;
  StringRefType local_50;
  StringRefType local_40;
  
  nexts.data_.n = (Number)0x0;
  nexts.data_.s.str = (Ch *)0x4000000000000;
  local_90 = (Number *)out_value;
  do {
    name = (StringRefType *)&value;
    create_info = (VkPipelineLibraryCreateInfoKHR *)pnext_chain_skip_ignored_entries(pNext);
    if (create_info == (VkPipelineLibraryCreateInfoKHR *)0x0) {
      if ((Number *)&nexts != local_90) {
        *local_90 = nexts.data_.n;
        local_90[1] = (Number)nexts.data_.s.str;
      }
      break;
    }
    next.data_.n = (Number)0x0;
    next.data_.s.str = (Ch *)0x0;
    VVar1 = create_info->sType;
    if (VVar1 == VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO) {
LAB_0010c417:
      pNext = create_info->pNext;
      bVar2 = true;
    }
    else {
      pVVar9 = &value_2;
      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT) {
        value.data_.n = (Number)0x0;
        value.data_.s.str = (Ch *)0x3000000000000;
        view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
        view_masks.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>(&value,(StringRefType *)&view_masks,create_info->sType,alloc);
        value_4.data_._4_1_ = '\0';
        value_4.data_._5_1_ = '\0';
        value_4.data_._6_1_ = '\0';
        value_4.data_._7_1_ = '\0';
        value_4.data_.s.length = create_info->libraryCount;
        value_2.data_.s.str = (Ch *)0x405000000150be7;
        value_2.data_.n = (Number)0x5;
        value_4.data_.s.str =
             (Ch *)((ulong)(-1 < (int)create_info->libraryCount) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&value,&value_2,&value_4,alloc);
        uVar4 = *(uint *)&create_info->field_0x14;
        value_2.data_.s.str = (Ch *)0x40500000015140d;
        value_2.data_.n = (Number)0x13;
LAB_0010ad85:
        value_4.data_._4_1_ = '\0';
        value_4.data_._5_1_ = '\0';
        value_4.data_._6_1_ = '\0';
        value_4.data_._7_1_ = '\0';
        value_4.data_.s.length = uVar4;
        value_4.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar4) << 0x35 | 0x1d6000000000000);
        pGVar5 = &value_4;
        goto LAB_0010c3f0;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO) {
        value.data_.n = (Number)0x0;
        value.data_.s.str = (Ch *)0x3000000000000;
        view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
        view_masks.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)name,(StringRefType *)&view_masks,create_info->sType,alloc);
        value_4.data_._4_1_ = '\0';
        value_4.data_._5_1_ = '\0';
        value_4.data_._6_1_ = '\0';
        value_4.data_._7_1_ = '\0';
        value_4.data_.s.length = create_info[1].sType;
        value_2.data_.s.str = (Ch *)0x4050000001515b4;
        value_2.data_.n = (Number)0x15;
        value_4.data_.s.str =
             (Ch *)((ulong)(-1 < (int)create_info[1].sType) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)name,&value_2,&value_4,alloc);
        value_4.data_._4_1_ = '\0';
        value_4.data_._5_1_ = '\0';
        value_4.data_._6_1_ = '\0';
        value_4.data_._7_1_ = '\0';
        value_4.data_.s.length = *(uint *)&create_info[1].field_0x4;
        value_2.data_.s.str = (Ch *)0x4050000001515ca;
        value_2.data_.n = (Number)0x17;
        value_4.data_.s.str =
             (Ch *)((ulong)(-1 < (int)*(uint *)&create_info[1].field_0x4) << 0x35 |
                   0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)name,&value_2,&value_4,alloc);
        value_4.data_._4_1_ = '\0';
        value_4.data_._5_1_ = '\0';
        value_4.data_._6_1_ = '\0';
        value_4.data_._7_1_ = '\0';
        value_4.data_.s.length = create_info->libraryCount;
        value_2.data_.s.str = (Ch *)0x405000000150e54;
        value_2.data_.n = (Number)0x8;
        value_4.data_.s.str =
             (Ch *)((ulong)(-1 < (int)create_info->libraryCount) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)name,&value_2,&value_4,alloc);
        if (*(int *)&create_info->field_0x14 != 0) {
          value_2.data_.n = (Number)0x0;
          value_2.data_.s.str = (Ch *)0x4000000000000;
          uVar6 = 0;
          do {
            uVar4 = *(uint *)((long)create_info->pLibraries + uVar6 * 4);
            value_4.data_._4_1_ = '\0';
            value_4.data_._5_1_ = '\0';
            value_4.data_._6_1_ = '\0';
            value_4.data_._7_1_ = '\0';
            value_4.data_.s.length = uVar4;
            value_4.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar4) << 0x35 | 0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&value_2,&value_4,alloc);
            uVar6 = uVar6 + 1;
          } while (uVar6 < *(uint *)&create_info->field_0x14);
          value_4.data_.s.str = (Ch *)0x4050000001515e2;
          value_4.data_.n = (Number)0x16;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&value,&value_4,&value_2,alloc);
        }
        next.data_.n = value.data_.n;
        next.data_.s.str = value.data_.s.str;
LAB_0010c402:
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&nexts,&next,alloc);
        goto LAB_0010c417;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO) {
        value_2.data_.n = (Number)0x0;
        value_2.data_.s.str = (Ch *)0x3000000000000;
        value.data_.n = (Number)anon_var_dwarf_3e7ae;
        value.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>(&value_2,name,create_info->sType,alloc);
        if (create_info->libraryCount != 0) {
          view_masks.data_.n = (Number)0x0;
          view_masks.data_.s.str = (Ch *)0x4000000000000;
          uVar6 = 0;
          do {
            uVar4 = *(uint *)((long)create_info->pLibraries + uVar6 * 4);
            value_4.data_._4_1_ = '\0';
            value_4.data_._5_1_ = '\0';
            value_4.data_._6_1_ = '\0';
            value_4.data_._7_1_ = '\0';
            value_4.data_.s.length = uVar4;
            value_4.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar4) << 0x35 | 0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&view_masks,&value_4,alloc);
            uVar6 = uVar6 + 1;
          } while (uVar6 < create_info->libraryCount);
          value_4.data_.s.str = (Ch *)0x405000000151985;
          value_4.data_.n = (Number)0x9;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&value_2,&value_4,&view_masks,alloc);
        }
        if (create_info[1].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
          view_masks.data_.n = (Number)0x0;
          view_masks.data_.s.str = (Ch *)0x4000000000000;
          uVar6 = 0;
          do {
            value_4.data_.n = (Number)(long)*(int *)((long)create_info[1].pNext + uVar6 * 4);
            uVar3 = 0x1f6;
            if ((long)value_4.data_.n < 0) {
              uVar3 = 0xb6;
            }
            value_4.data_.s.str = (Ch *)((ulong)uVar3 << 0x30);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&view_masks,&value_4,alloc);
            uVar6 = uVar6 + 1;
          } while (uVar6 < create_info[1].sType);
          value_4.data_.s.str = (Ch *)0x40500000015198f;
          value_4.data_.n = (Number)0xb;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&value_2,&value_4,&view_masks,alloc);
        }
        if (create_info[1].libraryCount != 0) {
          view_masks.data_.n = (Number)0x0;
          view_masks.data_.s.str = (Ch *)0x4000000000000;
          uVar6 = 0;
          do {
            uVar4 = *(uint *)((long)create_info[1].pLibraries + uVar6 * 4);
            value_4.data_._4_1_ = '\0';
            value_4.data_._5_1_ = '\0';
            value_4.data_._6_1_ = '\0';
            value_4.data_._7_1_ = '\0';
            value_4.data_.s.length = uVar4;
            value_4.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar4) << 0x35 | 0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&view_masks,&value_4,alloc);
            uVar6 = uVar6 + 1;
          } while (uVar6 < create_info[1].libraryCount);
          value_4.data_.s.str = (Ch *)0x40500000015199b;
          value_4.data_.n = (Number)0x10;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&value_2,&value_4,&view_masks,alloc);
        }
        next.data_.s.length = value_2.data_.s.length;
        next.data_.s.hashcode = value_2.data_.s.hashcode;
        next.data_._8_4_ = value_2.data_._8_4_;
        next.data_._12_4_ = value_2.data_._12_4_;
LAB_0010c2bb:
        goto LAB_0010c402;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO) {
        value_4.data_.n = (Number)0x0;
        value_4.data_.s.str = (Ch *)0x3000000000000;
        value_2.data_.n = (Number)anon_var_dwarf_3e7ae;
        value_2.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>(&value_4,(StringRefType *)&value_2,create_info->sType,alloc);
        value.data_.n = (Number)anon_var_dwarf_3e9a6;
        value.data_._8_4_ = 0xe;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkPipelineRobustnessBufferBehavior>
                  (&value_4,name,create_info->libraryCount,alloc);
        view_masks.data_.n = (Number)anon_var_dwarf_3e9b2;
        view_masks.data_._8_4_ = 0xc;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkPipelineRobustnessBufferBehavior>
                  (&value_4,(StringRefType *)&view_masks,
                   *(VkPipelineRobustnessBufferBehavior *)&create_info->pLibraries,alloc);
        locations.data_.n = (Number)anon_var_dwarf_3e99a;
        locations.data_._8_4_ = 0xe;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkPipelineRobustnessBufferBehavior>
                  (&value_4,(StringRefType *)&locations,
                   *(VkPipelineRobustnessBufferBehavior *)&create_info->field_0x14,alloc);
        discardRectangles.data_.n = (Number)anon_var_dwarf_3e98e;
        discardRectangles.data_._8_4_ = 6;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkPipelineRobustnessImageBehavior>
                  (&value_4,(StringRefType *)&discardRectangles,
                   *(VkPipelineRobustnessImageBehavior *)((long)&create_info->pLibraries + 4),alloc)
        ;
        goto LAB_0010bfa2;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT) {
        value.data_.n = (Number)0x0;
        value.data_.s.str = (Ch *)0x3000000000000;
        view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
        view_masks.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>(&value,(StringRefType *)&view_masks,create_info->sType,alloc);
        value_4.data_._4_1_ = '\0';
        value_4.data_._5_1_ = '\0';
        value_4.data_._6_1_ = '\0';
        value_4.data_._7_1_ = '\0';
        value_4.data_.s.length = create_info->libraryCount;
        value_2.data_.s.str = (Ch *)0x405000000150be7;
        value_2.data_.n = (Number)0x5;
        value_4.data_.s.str =
             (Ch *)((ulong)(-1 < (int)create_info->libraryCount) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&value,&value_2,&value_4,alloc);
        locations.data_.n = (Number)anon_var_dwarf_3e81a;
        locations.data_._8_4_ = 0x14;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkDiscardRectangleModeEXT>
                  (&value,(StringRefType *)&locations,
                   *(VkDiscardRectangleModeEXT *)&create_info->field_0x14,alloc);
        value_4.data_._4_1_ = '\0';
        value_4.data_._5_1_ = '\0';
        value_4.data_._6_1_ = '\0';
        value_4.data_._7_1_ = '\0';
        value_4.data_.s.length = *(uint *)&create_info->pLibraries;
        value_2.data_.s.str = (Ch *)0x4050000001516f9;
        value_2.data_.n = (Number)0x15;
        value_4.data_.s.str =
             (Ch *)((ulong)(-1 < (int)*(uint *)&create_info->pLibraries) << 0x35 | 0x1d6000000000000
                   );
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&value,&value_2,&value_4,alloc);
        if ((dynamic_state_info != (DynamicStateInfo *)0x0) &&
           (dynamic_state_info->discard_rectangle == false)) {
          discardRectangles.data_.n = (Number)0x0;
          discardRectangles.data_.s.str = (Ch *)0x4000000000000;
          if (*(int *)&create_info->pLibraries != 0) {
            lVar7 = 0;
            uVar6 = 0;
            do {
              discardRectangle.data_.n = (Number)0x0;
              discardRectangle.data_.s.str = (Ch *)0x3000000000000;
              extent.data_.n = (Number)((long)"%0*x" + 3);
              extent.data_._8_4_ = 1;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<int>(&discardRectangle,(StringRefType *)&extent,
                               *(int *)(*(long *)(create_info + 1) + lVar7),alloc);
              local_a8 = (char *)((long)"descriptorBufferCaptureReplay" + 0x1c);
              SStack_a0 = 1;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<int>(&discardRectangle,(StringRefType *)&local_a8,
                               *(int *)(*(long *)(create_info + 1) + 4 + lVar7),alloc);
              uVar4 = *(uint *)(*(long *)(create_info + 1) + 8 + lVar7);
              value_4.data_._4_1_ = '\0';
              value_4.data_._5_1_ = '\0';
              value_4.data_._6_1_ = '\0';
              value_4.data_._7_1_ = '\0';
              value_4.data_.s.length = uVar4;
              value_2.data_.s.str = (Ch *)0x40500000015125c;
              value_2.data_.n = (Number)0x5;
              value_4.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar4) << 0x35 | 0x1d6000000000000);
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember(&discardRectangle,&value_2,&value_4,alloc);
              uVar4 = *(uint *)(*(long *)(create_info + 1) + 0xc + lVar7);
              value_4.data_._4_1_ = '\0';
              value_4.data_._5_1_ = '\0';
              value_4.data_._6_1_ = '\0';
              value_4.data_._7_1_ = '\0';
              value_4.data_.s.length = uVar4;
              value_2.data_.s.str = (Ch *)0x405000000151262;
              value_2.data_.n = (Number)0x6;
              value_4.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar4) << 0x35 | 0x1d6000000000000);
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember(&discardRectangle,&value_2,&value_4,alloc);
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::PushBack(&discardRectangles,&discardRectangle,alloc);
              uVar6 = uVar6 + 1;
              lVar7 = lVar7 + 0x10;
            } while (uVar6 < *(uint *)&create_info->pLibraries);
          }
          value_4.data_.s.str = (Ch *)0x40500000015170f;
          value_4.data_.n = (Number)0x11;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&value,&value_4,&discardRectangles,alloc);
        }
        next.data_.n = value.data_.n;
        next.data_.s.str = value.data_.s.str;
        goto LAB_0010c402;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT) {
        value.data_.n = (Number)0x0;
        value.data_.s.str = (Ch *)0x3000000000000;
        view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
        view_masks.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>(&value,(StringRefType *)&view_masks,create_info->sType,alloc);
        value_4.data_._4_1_ = '\0';
        value_4.data_._5_1_ = '\0';
        value_4.data_._6_1_ = '\0';
        value_4.data_._7_1_ = '\0';
        value_4.data_.s.length = create_info->libraryCount;
        value_2.data_.s.str = (Ch *)0x405000000150be7;
        value_2.data_.n = (Number)0x5;
        value_4.data_.s.str =
             (Ch *)((ulong)(-1 < (int)create_info->libraryCount) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&value,&value_2,&value_4,alloc);
        locations.data_.n = (Number)anon_var_dwarf_3e68e;
        locations.data_._8_4_ = 0x1d;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkConservativeRasterizationModeEXT>
                  (&value,(StringRefType *)&locations,
                   *(VkConservativeRasterizationModeEXT *)&create_info->field_0x14,alloc);
        value_4.data_.n = (Number)(double)*(float *)&create_info->pLibraries;
        value_2.data_.s.str = (Ch *)0x40500000015147b;
        value_2.data_.n = (Number)0x20;
        value_4.data_.s.str = (Ch *)0x216000000000000;
        pGVar5 = &value_4;
        pVVar9 = &value_2;
        goto LAB_0010c3f0;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT) {
        value.data_.n = (Number)0x0;
        value.data_.s.str = (Ch *)0x3000000000000;
        view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
        view_masks.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>(&value,(StringRefType *)&view_masks,create_info->sType,alloc);
        value_4.data_._4_1_ = '\0';
        value_4.data_._5_1_ = '\0';
        value_4.data_._6_1_ = '\0';
        value_4.data_._7_1_ = '\0';
        value_4.data_.s.length = create_info->libraryCount;
        value_2.data_.s.str = (Ch *)0x405000000150be7;
        value_2.data_.n = (Number)0x5;
        value_4.data_.s.str =
             (Ch *)((ulong)(-1 < (int)create_info->libraryCount) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&value,&value_2,&value_4,alloc);
        uVar4 = *(uint *)&create_info->field_0x14;
        value_2.data_.s.str = (Ch *)0x4050000001513fd;
        value_2.data_.n = (Number)0xf;
        goto LAB_0010ad85;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO) {
        value.data_.n = (Number)0x0;
        value.data_.s.str = (Ch *)0x3000000000000;
        view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
        view_masks.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)name,(StringRefType *)&view_masks,create_info->sType,alloc);
        locations.data_.n = (Number)0x0;
        locations.data_.s.str = (Ch *)0x4000000000000;
        if (create_info->libraryCount != 0) {
          lVar7 = 0;
          uVar6 = 0;
          do {
            discardRectangles.data_.n = (Number)0x0;
            discardRectangles.data_.s.str = (Ch *)0x3000000000000;
            uVar4 = *(uint *)((long)create_info->pLibraries + lVar7);
            value_4.data_._4_1_ = '\0';
            value_4.data_._5_1_ = '\0';
            value_4.data_._6_1_ = '\0';
            value_4.data_._7_1_ = '\0';
            value_4.data_.s.length = uVar4;
            value_2.data_.s.str = (Ch *)0x405000000151326;
            value_2.data_.n = (Number)0x7;
            value_4.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar4) << 0x35 | 0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&discardRectangles,&value_2,&value_4,alloc);
            uVar4 = *(uint *)((long)create_info->pLibraries + lVar7 + 4);
            value_4.data_._4_1_ = '\0';
            value_4.data_._5_1_ = '\0';
            value_4.data_._6_1_ = '\0';
            value_4.data_._7_1_ = '\0';
            value_4.data_.s.length = uVar4;
            value_2.data_.s.str = (Ch *)0x4050000001516cf;
            value_2.data_.n = (Number)0x14;
            value_4.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar4) << 0x35 | 0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&discardRectangles,&value_2,&value_4,alloc);
            uVar4 = *(uint *)((long)create_info->pLibraries + lVar7 + 8);
            value_4.data_._4_1_ = '\0';
            value_4.data_._5_1_ = '\0';
            value_4.data_._6_1_ = '\0';
            value_4.data_._7_1_ = '\0';
            value_4.data_.s.length = uVar4;
            value_2.data_.s.str = (Ch *)0x405000000150dd7;
            value_2.data_.n = (Number)0xa;
            value_4.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar4) << 0x35 | 0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&discardRectangles,&value_2,&value_4,alloc);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&locations,&discardRectangles,alloc);
            uVar6 = uVar6 + 1;
            lVar7 = lVar7 + 0xc;
          } while (uVar6 < create_info->libraryCount);
        }
        value_4.data_.s.str = (Ch *)0x4050000001516be;
        value_4.data_.n = (Number)0x10;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&value,&value_4,&locations,alloc);
        next.data_.n = value.data_.n;
        next.data_.s.str = value.data_.s.str;
        goto LAB_0010c402;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO) {
        value_4.data_.n = (Number)0x0;
        value_4.data_.s.str = (Ch *)0x3000000000000;
        value_2.data_.n = (Number)anon_var_dwarf_3e7ae;
        value_2.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>(&value_4,(StringRefType *)&value_2,create_info->sType,alloc);
        value.data_.n = (Number)anon_var_dwarf_3e616;
        value.data_._8_4_ = 0xc;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkTessellationDomainOrigin>(&value_4,name,create_info->libraryCount,alloc);
LAB_0010bfa2:
        next.data_.s.length = value_4.data_.s.length;
        next.data_.s.hashcode = value_4.data_.s.hashcode;
        next.data_._8_4_ = value_4.data_._8_4_;
        next.data_._12_4_ = value_4.data_._12_4_;
LAB_0010c3fd:
        goto LAB_0010c402;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO) {
        value_4.data_.n = (Number)0x0;
        value_4.data_.s.str = (Ch *)0x3000000000000;
        value_2.data_.n = (Number)anon_var_dwarf_3e7ae;
        value_2.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>(&value_4,(StringRefType *)&value_2,create_info->sType,alloc);
        value.data_.n = (Number)anon_var_dwarf_3e7f6;
        value.data_._8_4_ = 0xd;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkSamplerReductionMode>(&value_4,name,create_info->libraryCount,alloc);
        goto LAB_0010bfa2;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT) {
        value.data_.n = (Number)0x0;
        value.data_.s.str = (Ch *)0x3000000000000;
        view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
        view_masks.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>(&value,(StringRefType *)&view_masks,create_info->sType,alloc);
        locations.data_.n = (Number)anon_var_dwarf_3e7ba;
        locations.data_._8_4_ = 0x17;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkSampleCountFlagBits>
                  (&value,(StringRefType *)&locations,create_info->libraryCount,alloc);
        discardRectangles.data_.n = (Number)0x0;
        discardRectangles.data_.s.str = (Ch *)0x3000000000000;
        value_4.data_._4_1_ = '\0';
        value_4.data_._5_1_ = '\0';
        value_4.data_._6_1_ = '\0';
        value_4.data_._7_1_ = '\0';
        value_4.data_.s.length = *(uint *)&create_info->field_0x14;
        value_2.data_.s.str = (Ch *)0x40500000015125c;
        value_2.data_.n = (Number)0x5;
        value_4.data_.s.str =
             (Ch *)((ulong)(-1 < (int)*(uint *)&create_info->field_0x14) << 0x35 | 0x1d6000000000000
                   );
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&discardRectangles,&value_2,&value_4,alloc);
        value_4.data_._4_1_ = '\0';
        value_4.data_._5_1_ = '\0';
        value_4.data_._6_1_ = '\0';
        value_4.data_._7_1_ = '\0';
        value_4.data_.s.length = *(uint *)&create_info->pLibraries;
        value_2.data_.s.str = (Ch *)0x405000000151262;
        value_2.data_.n = (Number)0x6;
        value_4.data_.s.str =
             (Ch *)((ulong)(-1 < (int)*(uint *)&create_info->pLibraries) << 0x35 | 0x1d6000000000000
                   );
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&discardRectangles,&value_2,&value_4,alloc);
        value_4.data_.s.str = (Ch *)0x405000000151663;
        value_4.data_.n = (Number)0x16;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&value,&value_4,&discardRectangles,alloc);
        if (*(int *)((long)&create_info->pLibraries + 4) != 0) {
          discardRectangles.data_.n = (Number)0x0;
          discardRectangles.data_.s.str = (Ch *)0x4000000000000;
          uVar6 = 0;
          do {
            discardRectangle.data_.n = (Number)0x0;
            discardRectangle.data_.s.str = (Ch *)0x3000000000000;
            value_4.data_.n = (Number)(double)*(float *)(*(long *)(create_info + 1) + uVar6 * 8);
            value_2.data_.s.str = (Ch *)0x40500000015059c;
            value_2.data_.n = (Number)0x1;
            value_4.data_.s.str = (Ch *)0x216000000000000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&discardRectangle,&value_2,&value_4,alloc);
            value_4.data_.n = (Number)(double)*(float *)(*(long *)(create_info + 1) + 4 + uVar6 * 8)
            ;
            value_2.data_.s.str = (Ch *)0x405000000151b71;
            value_2.data_.n = (Number)0x1;
            value_4.data_.s.str = (Ch *)0x216000000000000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&discardRectangle,&value_2,&value_4,alloc);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&discardRectangles,&discardRectangle,alloc);
            uVar6 = uVar6 + 1;
          } while (uVar6 < *(uint *)((long)&create_info->pLibraries + 4));
          value_4.data_.s.str = (Ch *)0x40500000015167a;
          value_4.data_.n = (Number)0xf;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&value,&value_4,&discardRectangles,alloc);
        }
LAB_0010c2b6:
        next.data_.s.length = value.data_.s.length;
        next.data_.s.hashcode = value.data_.s.hashcode;
        next.data_._8_4_ = value.data_._8_4_;
        next.data_._12_4_ = value.data_._12_4_;
        goto LAB_0010c2bb;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT) {
        value.data_.n = (Number)0x0;
        value.data_.s.str = (Ch *)0x3000000000000;
        view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
        view_masks.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)name,(StringRefType *)&view_masks,create_info->sType,alloc);
        value_4.data_._4_1_ = '\0';
        value_4.data_._5_1_ = '\0';
        value_4.data_._6_1_ = '\0';
        value_4.data_._7_1_ = '\0';
        value_4.data_.s.length = create_info->libraryCount;
        value_2.data_.s.str = (Ch *)0x40500000015161b;
        value_2.data_.n = (Number)0x15;
        value_4.data_.s.str =
             (Ch *)((ulong)(-1 < (int)create_info->libraryCount) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)name,&value_2,&value_4,alloc);
        if ((((dynamic_state_info != (DynamicStateInfo *)0x0) &&
             (dynamic_state_info->sample_locations_enable != false)) ||
            ((dynamic_state_info != (DynamicStateInfo *)0x0 && (create_info->libraryCount != 0))))
           && (dynamic_state_info->sample_locations == false)) {
          locations.data_.n = (Number)0x0;
          locations.data_.s.str = (Ch *)0x3000000000000;
          discardRectangles.data_.n = (Number)anon_var_dwarf_3e7ae;
          discardRectangles.data_._8_4_ = 5;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkStructureType>
                    (&locations,(StringRefType *)&discardRectangles,
                     *(VkStructureType *)&create_info->pLibraries,alloc);
          discardRectangle.data_.n = (Number)anon_var_dwarf_3e7ba;
          discardRectangle.data_._8_4_ = 0x17;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkSampleCountFlagBits>
                    (&locations,(StringRefType *)&discardRectangle,
                     *(VkSampleCountFlagBits *)&create_info[1].pNext,alloc);
          extent.data_.n = (Number)0x0;
          extent.data_.s.str = (Ch *)0x3000000000000;
          uVar4 = *(uint *)((long)&create_info[1].pNext + 4);
          value_4.data_._4_1_ = '\0';
          value_4.data_._5_1_ = '\0';
          value_4.data_._6_1_ = '\0';
          value_4.data_._7_1_ = '\0';
          value_4.data_.s.length = uVar4;
          value_2.data_.s.str = (Ch *)0x40500000015125c;
          value_2.data_.n = (Number)0x5;
          value_4.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar4) << 0x35 | 0x1d6000000000000);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&extent,&value_2,&value_4,alloc);
          value_4.data_._4_1_ = '\0';
          value_4.data_._5_1_ = '\0';
          value_4.data_._6_1_ = '\0';
          value_4.data_._7_1_ = '\0';
          value_4.data_.s.length = create_info[1].libraryCount;
          value_2.data_.s.str = (Ch *)0x405000000151262;
          value_2.data_.n = (Number)0x6;
          value_4.data_.s.str =
               (Ch *)((ulong)(-1 < (int)create_info[1].libraryCount) << 0x35 | 0x1d6000000000000);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&extent,&value_2,&value_4,alloc);
          value_4.data_.s.str = (Ch *)0x405000000151663;
          value_4.data_.n = (Number)0x16;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&locations,&value_4,&extent,alloc);
          if (*(int *)&create_info[1].field_0x14 != 0) {
            extent.data_.n = (Number)0x0;
            extent.data_.s.str = (Ch *)0x4000000000000;
            uVar6 = 0;
            do {
              local_a8 = (char *)0x0;
              _SStack_a0 = (Ch *)0x3000000000000;
              value_4.data_.n = (Number)(double)*(float *)(create_info[1].pLibraries + uVar6);
              value_2.data_.s.str = (Ch *)0x40500000015059c;
              value_2.data_.n = (Number)0x1;
              value_4.data_.s.str = (Ch *)0x216000000000000;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&local_a8,&value_2,&value_4,alloc);
              value_4.data_.n =
                   (Number)(double)*(float *)((long)create_info[1].pLibraries + uVar6 * 8 + 4);
              value_2.data_.s.str = (Ch *)0x405000000151b71;
              value_2.data_.n = (Number)0x1;
              value_4.data_.s.str = (Ch *)0x216000000000000;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&local_a8,&value_2,&value_4,alloc);
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::PushBack(&extent,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)&local_a8,alloc);
              uVar6 = uVar6 + 1;
            } while (uVar6 < *(uint *)&create_info[1].field_0x14);
            value_4.data_.s.str = (Ch *)0x40500000015167a;
            value_4.data_.n = (Number)0xf;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&locations,&value_4,&extent,alloc);
          }
          value_4.data_.s.str = (Ch *)0x405000000151631;
          value_4.data_.n = (Number)0x13;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&value,&value_4,&locations,alloc);
        }
LAB_0010c3f8:
        next.data_.s.length = value.data_.s.length;
        next.data_.s.hashcode = value.data_.s.hashcode;
        next.data_._8_4_ = value.data_._8_4_;
        next.data_._12_4_ = value.data_._12_4_;
        goto LAB_0010c3fd;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT) {
        value.data_.n = (Number)0x0;
        value.data_.s.str = (Ch *)0x3000000000000;
        view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
        view_masks.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)name,(StringRefType *)&view_masks,create_info->sType,alloc);
        value_4.data_._4_1_ = '\0';
        value_4.data_._5_1_ = '\0';
        value_4.data_._6_1_ = '\0';
        value_4.data_._7_1_ = '\0';
        value_4.data_.s.length = create_info->libraryCount;
        value_2.data_.s.str = (Ch *)0x40500000015143b;
        value_2.data_.n = (Number)0x10;
        value_4.data_.s.str =
             (Ch *)((ulong)(-1 < (int)create_info->libraryCount) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)name,&value_2,&value_4,alloc);
        value_4.data_._4_1_ = '\0';
        value_4.data_._5_1_ = '\0';
        value_4.data_._6_1_ = '\0';
        value_4.data_._7_1_ = '\0';
        value_4.data_.s.length = *(uint *)&create_info->field_0x14;
        value_2.data_.s.str = (Ch *)0x40500000015144c;
        value_2.data_.n = (Number)0x10;
        value_4.data_.s.str =
             (Ch *)((ulong)(-1 < (int)*(uint *)&create_info->field_0x14) << 0x35 | 0x1d6000000000000
                   );
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)name,&value_2,&value_4,alloc);
        value_4.data_.n = (Number)anon_var_dwarf_3e66a;
        value_4.data_._8_4_ = 0xc;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkBlendOverlapEXT>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)name,(StringRefType *)&value_4,*(VkBlendOverlapEXT *)&create_info->pLibraries,
                   alloc);
        goto LAB_0010c3f8;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO) {
        value.data_.n = (Number)0x0;
        value.data_.s.str = (Ch *)0x3000000000000;
        view_masks.data_.n = (Number)0x0;
        view_masks.data_.s.str = (Ch *)0x4000000000000;
        locations.data_.n = (Number)anon_var_dwarf_3e7ae;
        locations.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)name,(StringRefType *)&locations,create_info->sType,alloc);
        discardRectangles.data_.n = (Number)anon_var_dwarf_3e216;
        discardRectangles.data_._8_4_ = 6;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkFormat>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)name,(StringRefType *)&discardRectangles,create_info->libraryCount,alloc);
        discardRectangle.data_.n = (Number)anon_var_dwarf_3e892;
        discardRectangle.data_._8_4_ = 10;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkSamplerYcbcrModelConversion>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)name,(StringRefType *)&discardRectangle,
                   *(VkSamplerYcbcrModelConversion *)&create_info->field_0x14,alloc);
        extent.data_.n = (Number)anon_var_dwarf_3e89e;
        extent.data_._8_4_ = 10;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkSamplerYcbcrRange>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)name,(StringRefType *)&extent,*(VkSamplerYcbcrRange *)&create_info->pLibraries
                   ,alloc);
        value_4.data_.n = (Number)(long)*(int *)((long)&create_info->pLibraries + 4);
        uVar3 = 0xb6;
        if (-1 < (long)value_4.data_.n) {
          uVar3 = 0x1f6;
        }
        value_4.data_.s.str = (Ch *)((ulong)uVar3 << 0x30);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&view_masks,&value_4,alloc);
        value_4.data_.n = (Number)(long)(int)create_info[1].sType;
        uVar3 = 0xb6;
        if (-1 < (long)value_4.data_.n) {
          uVar3 = 0x1f6;
        }
        value_4.data_.s.str = (Ch *)((ulong)uVar3 << 0x30);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&view_masks,&value_4,alloc);
        value_4.data_.n = (Number)(long)*(int *)&create_info[1].field_0x4;
        uVar3 = 0xb6;
        if (-1 < (long)value_4.data_.n) {
          uVar3 = 0x1f6;
        }
        value_4.data_.s.str = (Ch *)((ulong)uVar3 << 0x30);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&view_masks,&value_4,alloc);
        value_4.data_.n = (Number)(long)*(int *)&create_info[1].pNext;
        uVar3 = 0xb6;
        if (-1 < (long)value_4.data_.n) {
          uVar3 = 0x1f6;
        }
        value_4.data_.s.str = (Ch *)((ulong)uVar3 << 0x30);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&view_masks,&value_4,alloc);
        value_4.data_.s.str = (Ch *)0x405000000151790;
        value_4.data_.n = (Number)0xa;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)name,&value_4,&view_masks,alloc);
        local_a8 = "xChromaOffset";
        SStack_a0 = 0xd;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkChromaLocation>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)name,(StringRefType *)&local_a8,
                   *(VkChromaLocation *)((long)&create_info[1].pNext + 4),alloc);
        local_40.s = "yChromaOffset";
        local_40.length = 0xd;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkChromaLocation>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)name,&local_40,create_info[1].libraryCount,alloc);
        local_50.s = "chromaFilter";
        local_50.length = 0xc;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkFilter>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)name,&local_50,*(VkFilter *)&create_info[1].field_0x14,alloc);
        uVar4 = *(uint *)&create_info[1].pLibraries;
        value_4.data_._4_1_ = '\0';
        value_4.data_._5_1_ = '\0';
        value_4.data_._6_1_ = '\0';
        value_4.data_._7_1_ = '\0';
        value_4.data_.s.length = uVar4;
        value_2.data_.s.str = (Ch *)0x4050000001517c4;
        value_2.data_.n = (Number)0x1b;
LAB_0010ae44:
        value_4.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar4) << 0x35 | 0x1d6000000000000);
        pGVar5 = &value_4;
        pVVar9 = &value_2;
        goto LAB_0010c3f0;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO) {
        value_2.data_.n = (Number)0x0;
        value_2.data_.s.str = (Ch *)0x3000000000000;
        value.data_.n = (Number)anon_var_dwarf_3e7ae;
        value.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>(&value_2,name,create_info->sType,alloc);
        if (create_info->libraryCount != 0) {
          view_masks.data_.n = (Number)0x0;
          view_masks.data_.s.str = (Ch *)0x4000000000000;
          uVar6 = 0;
          do {
            uVar4 = *(uint *)((long)create_info->pLibraries + uVar6 * 4);
            value_4.data_._4_1_ = '\0';
            value_4.data_._5_1_ = '\0';
            value_4.data_._6_1_ = '\0';
            value_4.data_._7_1_ = '\0';
            value_4.data_.s.length = uVar4;
            value_4.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar4) << 0x35 | 0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&view_masks,&value_4,alloc);
            uVar6 = uVar6 + 1;
          } while (uVar6 < create_info->libraryCount);
          value_4.data_.s.str = (Ch *)0x405000000151421;
          value_4.data_.n = (Number)0xc;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&value_2,&value_4,&view_masks,alloc);
        }
LAB_0010b487:
        next.data_.s.length = value_2.data_.s.length;
        next.data_.s.hashcode = value_2.data_.s.hashcode;
        next.data_._8_4_ = value_2.data_._8_4_;
        next.data_._12_4_ = value_2.data_._12_4_;
        goto LAB_0010c3fd;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO) {
        value.data_.n = (Number)0x0;
        value.data_.s.str = (Ch *)0x3000000000000;
        view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
        view_masks.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)name,(StringRefType *)&view_masks,create_info->sType,alloc);
        value_4.data_._4_1_ = '\0';
        value_4.data_._5_1_ = '\0';
        value_4.data_._6_1_ = '\0';
        value_4.data_._7_1_ = '\0';
        value_4.data_.s.length = create_info->libraryCount;
        value_2.data_.s.str = (Ch *)0x4050000001513c5;
        value_2.data_.n = (Number)0x19;
        value_4.data_.s.str =
             (Ch *)((ulong)(-1 < (int)create_info->libraryCount) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)name,&value_2,&value_4,alloc);
        if (create_info->pLibraries != (VkPipeline *)0x0) {
          locations.data_.n = (Number)0x0;
          locations.data_.s.str = (Ch *)0x4000000000000;
          if (create_info->libraryCount != 0) {
            uVar6 = 0;
            do {
              discardRectangles.data_.n = (Number)0x0;
              discardRectangles.data_.s.str = (Ch *)0x3000000000000;
              value_4.data_._4_1_ = '\0';
              value_4.data_._5_1_ = '\0';
              value_4.data_._6_1_ = '\0';
              value_4.data_._7_1_ = '\0';
              value_4.data_.s.length = *(uint *)(create_info->pLibraries + uVar6);
              value_2.data_.s.str = (Ch *)0x405000000150b86;
              value_2.data_.n = (Number)0x7;
              value_4.data_.s.str =
                   (Ch *)((ulong)(-1 < (int)*(uint *)(create_info->pLibraries + uVar6)) << 0x35 |
                         0x1d6000000000000);
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember(&discardRectangles,&value_2,&value_4,alloc);
              uVar4 = *(uint *)((long)create_info->pLibraries + uVar6 * 8 + 4);
              value_4.data_._4_1_ = '\0';
              value_4.data_._5_1_ = '\0';
              value_4.data_._6_1_ = '\0';
              value_4.data_._7_1_ = '\0';
              value_4.data_.s.length = uVar4;
              value_2.data_.s.str = (Ch *)0x4050000001513f5;
              value_2.data_.n = (Number)0x7;
              value_4.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar4) << 0x35 | 0x1d6000000000000);
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember(&discardRectangles,&value_2,&value_4,alloc);
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::PushBack(&locations,&discardRectangles,alloc);
              uVar6 = uVar6 + 1;
            } while (uVar6 < create_info->libraryCount);
          }
          value_4.data_.s.str = (Ch *)0x4050000001513df;
          value_4.data_.n = (Number)0x15;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&value,&value_4,&locations,alloc);
        }
        goto LAB_0010c3f8;
      }
      pNext = create_info;
      if (VVar1 == VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE) {
        value_2.data_.n = (Number)0x0;
        value_2.data_.s.str = (Ch *)0x3000000000000;
        value.data_.n = (Number)anon_var_dwarf_3e7ae;
        value.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>(&value_2,name,create_info->sType,alloc);
        view_masks.data_.n = (Number)anon_var_dwarf_3e71e;
        view_masks.data_._8_4_ = 0x10;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkResolveModeFlagBits>
                  (&value_2,(StringRefType *)&view_masks,create_info->libraryCount,alloc);
        locations.data_.n = (Number)anon_var_dwarf_3e72a;
        locations.data_._8_4_ = 0x12;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkResolveModeFlagBits>
                  (&value_2,(StringRefType *)&locations,
                   *(VkResolveModeFlagBits *)&create_info->field_0x14,alloc);
        if ((VkAttachmentReference2 *)create_info->pLibraries != (VkAttachmentReference2 *)0x0) {
          discardRectangles.data_.n = (Number)0x0;
          discardRectangles.data_.s.str = (Ch *)0x0;
          pGVar5 = &discardRectangles;
          bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            ((VkAttachmentReference2 *)create_info->pLibraries,alloc,pGVar5);
          if (!bVar2) goto LAB_0010c454;
          value_4.data_.s.str = (Ch *)0x405000000151559;
          value_4.data_.n = (Number)0x1d;
LAB_0010b47f:
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&value_2,&value_4,pGVar5,alloc);
        }
        goto LAB_0010b487;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT) {
        value.data_.n = (Number)0x0;
        value.data_.s.str = (Ch *)0x3000000000000;
        view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
        view_masks.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)name,(StringRefType *)&view_masks,create_info->sType,alloc);
        locations.data_.n = (Number)0x0;
        locations.data_.s.str = (Ch *)0x3000000000000;
        value_4.data_._4_1_ = '\0';
        value_4.data_._5_1_ = '\0';
        value_4.data_._6_1_ = '\0';
        value_4.data_._7_1_ = '\0';
        value_4.data_.s.length = create_info->libraryCount;
        value_2.data_.s.str = (Ch *)0x405000000151872;
        value_2.data_.n = (Number)0xa;
        value_4.data_.s.str =
             (Ch *)((ulong)(-1 < (int)create_info->libraryCount) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&locations,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&value_2,&value_4,alloc);
        value_2.data_.n = (Number)((long)"Pipeline layout" + 9);
        value_2.data_._8_4_ = 6;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkImageLayout>
                  (&locations,(StringRefType *)&value_2,*(VkImageLayout *)&create_info->field_0x14,
                   alloc);
        value_4.data_.s.str = (Ch *)0x405000000151855;
        value_4.data_.n = (Number)0x1c;
        pGVar5 = &locations;
        pVVar9 = &value_4;
        goto LAB_0010c3f0;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO) {
        value.data_.n = (Number)0x0;
        value.data_.s.str = (Ch *)0x3000000000000;
        view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
        view_masks.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)name,(StringRefType *)&view_masks,create_info->sType,alloc);
        value_4.data_._4_1_ = '\0';
        value_4.data_._5_1_ = '\0';
        value_4.data_._6_1_ = '\0';
        value_4.data_._7_1_ = '\0';
        value_4.data_.s.length = create_info->libraryCount;
        value_2.data_.s.str = (Ch *)0x4050000001514ea;
        value_2.data_.n = (Number)0x14;
        goto LAB_0010ae1f;
      }
      if (VVar1 != VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR) {
        if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR) {
          value.data_.n = (Number)0x0;
          value.data_.s.str = (Ch *)0x3000000000000;
          view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
          view_masks.data_._8_4_ = 5;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkStructureType>
                    ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)name,(StringRefType *)&view_masks,create_info->sType,alloc);
          if ((dynamic_state_info != (DynamicStateInfo *)0x0) &&
             (dynamic_state_info->fragment_shading_rate == false)) {
            locations.data_.n = (Number)0x0;
            locations.data_.s.str = (Ch *)0x3000000000000;
            value_4.data_._4_1_ = '\0';
            value_4.data_._5_1_ = '\0';
            value_4.data_._6_1_ = '\0';
            value_4.data_._7_1_ = '\0';
            value_4.data_.s.length = create_info->libraryCount;
            value_2.data_.s.str = (Ch *)0x40500000015125c;
            value_2.data_.n = (Number)0x5;
            value_4.data_.s.str =
                 (Ch *)((ulong)(-1 < (int)create_info->libraryCount) << 0x35 | 0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&locations,&value_2,&value_4,alloc);
            value_4.data_._4_1_ = '\0';
            value_4.data_._5_1_ = '\0';
            value_4.data_._6_1_ = '\0';
            value_4.data_._7_1_ = '\0';
            value_4.data_.s.length = *(uint *)&create_info->field_0x14;
            value_2.data_.s.str = (Ch *)0x405000000151262;
            value_2.data_.n = (Number)0x6;
            value_4.data_.s.str =
                 (Ch *)((ulong)(-1 < (int)*(uint *)&create_info->field_0x14) << 0x35 |
                       0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&locations,&value_2,&value_4,alloc);
            value_4.data_.s.str = (Ch *)0x405000000151761;
            value_4.data_.n = (Number)0xc;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)name,&value_4,&locations,alloc);
            value_2.data_.n = (Number)0x0;
            value_2.data_.s.str = (Ch *)0x4000000000000;
            lVar7 = 0;
            do {
              value_4.data_.n = (Number)(long)*(int *)((long)&create_info->pLibraries + lVar7 * 4);
              uVar3 = 0xb6;
              if (-1 < (long)value_4.data_.n) {
                uVar3 = 0x1f6;
              }
              value_4.data_.s.str = (Ch *)((ulong)uVar3 << 0x30);
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::PushBack(&value_2,&value_4,alloc);
              lVar7 = lVar7 + 1;
            } while (lVar7 == 1);
            value_4.data_.s.str = (Ch *)0x40500000015176e;
            value_4.data_.n = (Number)0xb;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&value,&value_4,&value_2,alloc);
          }
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO) {
          value.data_.n = (Number)0x0;
          value.data_.s.str = (Ch *)0x3000000000000;
          view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
          view_masks.data_._8_4_ = 5;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkStructureType>
                    ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)name,(StringRefType *)&view_masks,create_info->sType,alloc);
          value_4.data_._4_1_ = '\0';
          value_4.data_._5_1_ = '\0';
          value_4.data_._6_1_ = '\0';
          value_4.data_._7_1_ = '\0';
          value_4.data_.s.length = create_info->libraryCount;
          value_2.data_.s.str = (Ch *)0x4050000001518ea;
          value_2.data_.n = (Number)0x14;
          value_4.data_.s.str =
               (Ch *)((ulong)(-1 < (int)create_info->libraryCount) << 0x35 | 0x1d6000000000000);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)name,&value_2,&value_4,alloc);
          if (create_info->pLibraries != (VkPipeline *)0x0) {
            value_2.data_.n = (Number)0x0;
            value_2.data_.s.str = (Ch *)0x4000000000000;
            if (create_info->libraryCount != 0) {
              uVar6 = 0;
              do {
                uVar4 = *(uint *)((long)create_info->pLibraries + uVar6 * 4);
                value_4.data_._4_1_ = '\0';
                value_4.data_._5_1_ = '\0';
                value_4.data_._6_1_ = '\0';
                value_4.data_._7_1_ = '\0';
                value_4.data_.s.length = uVar4;
                value_4.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar4) << 0x35 | 0x1d6000000000000);
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::PushBack(&value_2,&value_4,alloc);
                uVar6 = uVar6 + 1;
              } while (uVar6 < create_info->libraryCount);
            }
            value_4.data_.s.str = (Ch *)0x4050000001518ff;
            value_4.data_.n = (Number)0x18;
LAB_0010afe8:
            pGVar5 = &value_2;
            pVVar9 = &value_4;
LAB_0010c3f0:
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&value,pVVar9,pGVar5,alloc);
          }
        }
        else {
          if (VVar1 != VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO) {
            if (VVar1 == VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT) {
              value_4.data_.n = (Number)0x0;
              value_4.data_.s.str = (Ch *)0x3000000000000;
              value_2.data_.n = (Number)anon_var_dwarf_3e7ae;
              value_2.data_._8_4_ = 5;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<VkStructureType>
                        (&value_4,(StringRefType *)&value_2,create_info->sType,alloc);
              value.data_.n = (Number)anon_var_dwarf_3e712;
              value.data_._8_4_ = 0xd;
              value_00 = create_info->libraryCount;
            }
            else {
              if (VVar1 != VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT) {
                if (VVar1 == 
                    VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT)
                {
                  value_4.data_.n = (Number)0x0;
                  value_4.data_.s.str = (Ch *)0x3000000000000;
                  value_2.data_.n = (Number)anon_var_dwarf_3e7ae;
                  value_2.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>
                            (&value_4,(StringRefType *)&value_2,create_info->sType,alloc);
                  value.data_.n = (Number)anon_var_dwarf_3e7de;
                  value.data_._8_4_ = 0x13;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkProvokingVertexModeEXT>
                            (&value_4,name,create_info->libraryCount,alloc);
                  goto LAB_0010bfa2;
                }
                if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO) {
                  value.data_.n = (Number)0x0;
                  value.data_.s.str = (Ch *)0x3000000000000;
                  view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
                  view_masks.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>
                            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)name,(StringRefType *)&view_masks,create_info->sType,alloc);
                  locations.data_.n = (Number)anon_var_dwarf_3e6be;
                  locations.data_._8_4_ = 0x15;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkLineRasterizationMode>
                            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)name,(StringRefType *)&locations,create_info->libraryCount,alloc);
                  value_4.data_._4_1_ = '\0';
                  value_4.data_._5_1_ = '\0';
                  value_4.data_._6_1_ = '\0';
                  value_4.data_._7_1_ = '\0';
                  value_4.data_.s.length = *(uint *)&create_info->field_0x14;
                  value_2.data_.s.str = (Ch *)0x4050000001514b2;
                  value_2.data_.n = (Number)0x12;
                  value_4.data_.s.str =
                       (Ch *)((ulong)(-1 < (int)*(uint *)&create_info->field_0x14) << 0x35 |
                             0x1d6000000000000);
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)name,&value_2,&value_4,alloc);
                  value_4.data_._4_1_ = '\0';
                  value_4.data_._5_1_ = '\0';
                  value_4.data_._6_1_ = '\0';
                  value_4.data_._7_1_ = '\0';
                  value_4.data_.s.length = *(uint *)&create_info->pLibraries;
                  value_2.data_.s.str = (Ch *)0x4050000001514c5;
                  value_2.data_.n = (Number)0x11;
                  value_4.data_.s.str =
                       (Ch *)((ulong)(-1 < (int)*(uint *)&create_info->pLibraries) << 0x35 |
                             0x1d6000000000000);
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)name,&value_2,&value_4,alloc);
                  value_4.data_._2_6_ = 0;
                  value_4.data_._0_2_ = *(ushort *)((long)&create_info->pLibraries + 4);
                  value_2.data_.s.str = (Ch *)0x4050000001514d7;
                  value_2.data_.n = (Number)0x12;
                  value_4.data_.s.str = (Ch *)0x1f6000000000000;
                  pGVar5 = &value_4;
                  goto LAB_0010c3f0;
                }
                if (VVar1 == VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT) {
                  value.data_.n = (Number)0x0;
                  value.data_.s.str = (Ch *)0x3000000000000;
                  view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
                  view_masks.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>
                            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)name,(StringRefType *)&view_masks,create_info->sType,alloc);
                  locations.data_.n = (Number)anon_var_dwarf_3e96a;
                  locations.data_._8_4_ = 0x17;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkDepthBiasRepresentationEXT>
                            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)name,(StringRefType *)&locations,create_info->libraryCount,alloc);
                  value_4.data_._4_1_ = '\0';
                  value_4.data_._5_1_ = '\0';
                  value_4.data_._6_1_ = '\0';
                  value_4.data_._7_1_ = '\0';
                  value_4.data_.s.length = *(uint *)&create_info->field_0x14;
                  value_2.data_.s.str = (Ch *)0x40500000015182e;
                  value_2.data_.n = (Number)0xe;
                  goto LAB_0010ae1f;
                }
                if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT) {
                  value_2.data_.n = (Number)0x0;
                  value_2.data_.s.str = (Ch *)0x3000000000000;
                  value.data_.n = (Number)anon_var_dwarf_3e7ae;
                  value.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>(&value_2,name,create_info->sType,alloc);
                  view_masks.data_.n = (Number)0x0;
                  view_masks.data_.s.str = (Ch *)0x4000000000000;
                  lVar7 = 0;
                  do {
                    value_4.data_._4_1_ = '\0';
                    value_4.data_._5_1_ = '\0';
                    value_4.data_._6_1_ = '\0';
                    value_4.data_._7_1_ = '\0';
                    value_4.data_.s.length = (&create_info->libraryCount)[lVar7];
                    value_4.data_.s.str =
                         (Ch *)((ulong)(-1 < (int)(&create_info->libraryCount)[lVar7]) << 0x35 |
                               0x1d6000000000000);
                    rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::PushBack(&view_masks,&value_4,alloc);
                    lVar7 = lVar7 + 1;
                  } while (lVar7 != 4);
                  value_4.data_.s.str = (Ch *)0x40500000015169e;
                  value_4.data_.n = (Number)0x11;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember(&value_2,&value_4,&view_masks,alloc);
                  value_4.data_.n = (Number)anon_var_dwarf_3e216;
                  value_4.data_._8_4_ = 6;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkFormat>
                            (&value_2,(StringRefType *)&value_4,create_info[1].sType,alloc);
                  next.data_.n = value_2.data_.n;
                  next.data_.s.str = value_2.data_.s.str;
                  goto LAB_0010c402;
                }
                if (VVar1 == VK_STRUCTURE_TYPE_MEMORY_BARRIER_2) {
                  value_4.data_.n = (Number)0x0;
                  value_4.data_.s.str = (Ch *)0x3000000000000;
                  value_2.data_.n = (Number)anon_var_dwarf_3e7ae;
                  value_2.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>
                            (&value_4,(StringRefType *)&value_2,create_info->sType,alloc);
                  value.data_.n = (Number)anon_var_dwarf_3e83e;
                  value.data_._8_4_ = 0xc;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<unsigned_long>
                            (&value_4,name,*(unsigned_long *)&create_info->libraryCount,alloc);
                  view_masks.data_.n = (Number)anon_var_dwarf_3e84a;
                  view_masks.data_._8_4_ = 0xd;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<unsigned_long>
                            (&value_4,(StringRefType *)&view_masks,
                             (unsigned_long)create_info->pLibraries,alloc);
                  locations.data_.n = (Number)anon_var_dwarf_3e856;
                  locations.data_._8_4_ = 0xc;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<unsigned_long>
                            (&value_4,(StringRefType *)&locations,
                             *(unsigned_long *)(create_info + 1),alloc);
                  discardRectangles.data_.n = (Number)anon_var_dwarf_3e862;
                  discardRectangles.data_._8_4_ = 0xd;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<unsigned_long>
                            (&value_4,(StringRefType *)&discardRectangles,
                             (unsigned_long)create_info[1].pNext,alloc);
                  next.data_.s.length = value_4.data_.s.length;
                  next.data_.s.hashcode = value_4.data_.s.hashcode;
                  next.data_._8_4_ = value_4.data_._8_4_;
                  next.data_._12_4_ = value_4.data_._12_4_;
                  goto LAB_0010c2bb;
                }
                if (VVar1 == VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT) {
                  value.data_.n = (Number)0x0;
                  value.data_.s.str = (Ch *)0x3000000000000;
                  view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
                  view_masks.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>
                            (&value,(StringRefType *)&view_masks,create_info->sType,alloc);
                  value_4.data_._4_1_ = '\0';
                  value_4.data_._5_1_ = '\0';
                  value_4.data_._6_1_ = '\0';
                  value_4.data_._7_1_ = '\0';
                  value_4.data_.s.length = create_info->libraryCount;
                  value_2.data_.s.str = (Ch *)0x405000000150be7;
                  value_2.data_.n = (Number)0x5;
                  value_4.data_.s.str =
                       (Ch *)((ulong)(-1 < (int)create_info->libraryCount) << 0x35 |
                             0x1d6000000000000);
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember(&value,&value_2,&value_4,alloc);
                  goto LAB_0010c2b6;
                }
                if (VVar1 == VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT) {
                  value_2.data_.n = (Number)0x0;
                  value_2.data_.s.str = (Ch *)0x3000000000000;
                  value.data_.n = (Number)anon_var_dwarf_3e7ae;
                  value.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>(&value_2,name,create_info->sType,alloc);
                  view_masks.data_.n = (Number)0x0;
                  view_masks.data_.s.str = (Ch *)0x4000000000000;
                  if (create_info->libraryCount != 0) {
                    uVar6 = 0;
                    do {
                      locations.data_.n = (Number)0x0;
                      locations.data_.s.str = (Ch *)0x4000000000000;
                      if (*(int *)(create_info->pLibraries + uVar6 * 2) != 0) {
                        ppVVar8 = create_info->pLibraries + uVar6 * 2;
                        uVar10 = 0;
                        do {
                          value_4.data_.n = (Number)(long)*(int *)(ppVVar8[1] + uVar10 * 4);
                          uVar3 = 0x1f6;
                          if ((long)value_4.data_.n < 0) {
                            uVar3 = 0xb6;
                          }
                          value_4.data_.s.str = (Ch *)((ulong)uVar3 << 0x30);
                          rapidjson::
                          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ::PushBack(&locations,&value_4,alloc);
                          uVar10 = uVar10 + 1;
                        } while (uVar10 < *(uint *)ppVVar8);
                      }
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::PushBack(&view_masks,&locations,alloc);
                      uVar6 = uVar6 + 1;
                    } while (uVar6 < create_info->libraryCount);
                  }
                  value_4.data_.s.str = (Ch *)0x40500000015196a;
                  value_4.data_.n = (Number)0x1a;
                  pGVar5 = &view_masks;
                  goto LAB_0010b47f;
                }
                if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT)
                {
                  value.data_.n = (Number)0x0;
                  value.data_.s.str = (Ch *)0x3000000000000;
                  view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
                  view_masks.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>
                            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)name,(StringRefType *)&view_masks,create_info->sType,alloc);
                  value_4.data_._4_1_ = '\0';
                  value_4.data_._5_1_ = '\0';
                  value_4.data_._6_1_ = '\0';
                  value_4.data_._7_1_ = '\0';
                  value_4.data_.s.length = create_info->libraryCount;
                  value_2.data_.s.str = (Ch *)0x4050000001517e0;
                  value_2.data_.n = (Number)0x10;
                }
                else {
                  if (VVar1 != VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT) {
                    if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT) {
                      value.data_.n = (Number)0x0;
                      value.data_.s.str = (Ch *)0x3000000000000;
                      view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
                      view_masks.data_._8_4_ = 5;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<VkStructureType>
                                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)name,(StringRefType *)&view_masks,create_info->sType,alloc);
                      value_4.data_._4_1_ = '\0';
                      value_4.data_._5_1_ = '\0';
                      value_4.data_._6_1_ = '\0';
                      value_4.data_._7_1_ = '\0';
                      value_4.data_.s.length = create_info->libraryCount;
                      value_2.data_.s.str = (Ch *)0x4050000001515f9;
                      value_2.data_.n = (Number)0xf;
                      value_4.data_.s.str =
                           (Ch *)((ulong)(-1 < (int)create_info->libraryCount) << 0x35 |
                                 0x1d6000000000000);
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                   *)name,&value_2,&value_4,alloc);
                      if (dynamic_state_info != (DynamicStateInfo *)0x0) {
                        if ((create_info->pLibraries != (VkPipeline *)0x0) &&
                           (dynamic_state_info->color_write_enable == false)) {
                          value_2.data_.n = (Number)0x0;
                          value_2.data_.s.str = (Ch *)0x4000000000000;
                          if (create_info->libraryCount != 0) {
                            uVar6 = 0;
                            do {
                              uVar4 = *(uint *)((long)create_info->pLibraries + uVar6 * 4);
                              value_4.data_._4_1_ = '\0';
                              value_4.data_._5_1_ = '\0';
                              value_4.data_._6_1_ = '\0';
                              value_4.data_._7_1_ = '\0';
                              value_4.data_.s.length = uVar4;
                              value_4.data_.s.str =
                                   (Ch *)((ulong)(-1 < (int)uVar4) << 0x35 | 0x1d6000000000000);
                              rapidjson::
                              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              ::PushBack(&value_2,&value_4,alloc);
                              uVar6 = uVar6 + 1;
                            } while (uVar6 < create_info->libraryCount);
                          }
                          value_4.data_.s.str = (Ch *)0x405000000151609;
                          value_4.data_.n = (Number)0x11;
                          goto LAB_0010afe8;
                        }
                        goto LAB_0010c3f8;
                      }
LAB_0010c454:
                      bVar2 = false;
                      goto LAB_0010c41d;
                    }
                    if (VVar1 == 
                        VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT) {
                      value.data_.n = (Number)0x0;
                      value.data_.s.str = (Ch *)0x3000000000000;
                      view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
                      view_masks.data_._8_4_ = 5;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<VkStructureType>
                                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)name,(StringRefType *)&view_masks,create_info->sType,alloc);
                      value_4.data_._4_1_ = '\0';
                      value_4.data_._5_1_ = '\0';
                      value_4.data_._6_1_ = '\0';
                      value_4.data_._7_1_ = '\0';
                      value_4.data_.s.length = create_info[1].sType;
                      value_2.data_.s.str = (Ch *)0x405000000151801;
                      value_2.data_.n = (Number)0x4;
                      value_4.data_.s.str =
                           (Ch *)((ulong)(-1 < (int)create_info[1].sType) << 0x35 |
                                 0x1d6000000000000);
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                   *)name,&value_2,&value_4,alloc);
                      value_2.data_.n = (Number)0x0;
                      value_2.data_.s.str = (Ch *)0x3000000000000;
                      locations.data_.n =
                           (Number)((long)"primitiveFragmentShadingRateMeshShader" + 0x25);
                      locations.data_._8_4_ = 1;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<VkComponentSwizzle>
                                (&value_2,(StringRefType *)&locations,create_info->libraryCount,
                                 alloc);
                      discardRectangles.data_.n =
                           (Number)((long)"data_.f.flags & kUint64Flag" + 0x1a);
                      discardRectangles.data_._8_4_ = 1;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<VkComponentSwizzle>
                                (&value_2,(StringRefType *)&discardRectangles,
                                 *(VkComponentSwizzle *)&create_info->field_0x14,alloc);
                      discardRectangle.data_.n = (Number)((long)"r+b" + 2);
                      discardRectangle.data_._8_4_ = 1;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<VkComponentSwizzle>
                                (&value_2,(StringRefType *)&discardRectangle,
                                 *(VkComponentSwizzle *)&create_info->pLibraries,alloc);
                      extent.data_.n = (Number)((long)"data" + 3);
                      extent.data_._8_4_ = 1;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<VkComponentSwizzle>
                                (&value_2,(StringRefType *)&extent,
                                 *(VkComponentSwizzle *)((long)&create_info->pLibraries + 4),alloc);
                      value_4.data_.s.str = (Ch *)0x405000000151790;
                      value_4.data_.n = (Number)0xa;
                      pGVar5 = &value_2;
                      pVVar9 = &value_4;
                    }
                    else {
                      if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT) {
                        value.data_.n = (Number)0x0;
                        value.data_.s.str = (Ch *)0x3000000000000;
                        view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
                        view_masks.data_._8_4_ = 5;
                        rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::AddMember<VkStructureType>
                                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                    *)name,(StringRefType *)&view_masks,create_info->sType,alloc);
                        value_4.data_._4_1_ = '\0';
                        value_4.data_._5_1_ = '\0';
                        value_4.data_._6_1_ = '\0';
                        value_4.data_._7_1_ = '\0';
                        value_4.data_.s.length = create_info->libraryCount;
                        value_2.data_.s.str = (Ch *)0x4050000001517f1;
                        value_2.data_.n = (Number)0xf;
                        goto LAB_0010ae1f;
                      }
                      if (VVar1 == 
                          VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT)
                      goto LAB_0010c417;
                      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO) {
                        value_4.data_.n = (Number)0x0;
                        value_4.data_.s.str = (Ch *)0x3000000000000;
                        value_2.data_.n = (Number)anon_var_dwarf_3e7ae;
                        value_2.data_._8_4_ = 5;
                        rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::AddMember<VkStructureType>
                                  (&value_4,(StringRefType *)&value_2,create_info->sType,alloc);
                        value.data_.n = (Number)anon_var_dwarf_3deb9;
                        value.data_._8_4_ = 5;
                        rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::AddMember<unsigned_long>
                                  (&value_4,(StringRefType *)&value,
                                   *(unsigned_long *)&create_info->libraryCount,alloc);
                        goto LAB_0010bfa2;
                      }
                      if (VVar1 != 
                          VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT) {
                        if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR) {
                          value_4.data_.n = (Number)0x2b;
                          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                          local_70._M_dataplus._M_p =
                               (pointer)std::__cxx11::string::_M_create
                                                  ((ulong *)&local_70,(ulong)&value_4);
                          local_70.field_2._M_allocated_capacity = (size_type)value_4.data_.n;
                          builtin_strncpy(local_70._M_dataplus._M_p,
                                          "Unsupported pNext found, cannot hash sType.",0x2b);
                          local_70._M_string_length = (size_type)value_4.data_.n;
                          local_70._M_dataplus._M_p[(long)value_4.data_.n] = '\0';
                          log_error_pnext_chain(&local_70,create_info);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_70._M_dataplus._M_p != &local_70.field_2) {
                            operator_delete(local_70._M_dataplus._M_p,
                                            local_70.field_2._M_allocated_capacity + 1);
                          }
                          goto LAB_0010c431;
                        }
                        bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                          (create_info,alloc,true,&next);
                        if (bVar2) goto LAB_0010c402;
                        goto LAB_0010c454;
                      }
                      value.data_.n = (Number)0x0;
                      value.data_.s.str = (Ch *)0x3000000000000;
                      view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
                      view_masks.data_._8_4_ = 5;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<VkStructureType>
                                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)name,(StringRefType *)&view_masks,create_info->sType,alloc);
                      locations.data_.n = (Number)anon_var_dwarf_3e9be;
                      locations.data_._8_4_ = 0xe;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<VkDepthClampModeEXT>
                                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)name,(StringRefType *)&locations,create_info->libraryCount,alloc
                                );
                      if (create_info->pLibraries == (VkPipeline *)0x0) goto LAB_0010c3f8;
                      discardRectangles.data_.n = (Number)0x0;
                      discardRectangles.data_.s.str = (Ch *)0x3000000000000;
                      value_4.data_.n = (Number)(double)*(float *)create_info->pLibraries;
                      value_2.data_.s.str = (Ch *)0x4050000001518ce;
                      value_2.data_.n = (Number)0xd;
                      value_4.data_.s.str = (Ch *)0x216000000000000;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember(&discardRectangles,&value_2,&value_4,alloc);
                      value_4.data_.n =
                           (Number)(double)*(float *)((long)create_info->pLibraries + 4);
                      value_2.data_.s.str = (Ch *)0x4050000001518dc;
                      value_2.data_.n = (Number)0xd;
                      value_4.data_.s.str = (Ch *)0x216000000000000;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember(&discardRectangles,&value_2,&value_4,alloc);
                      value_4.data_.s.str = (Ch *)0x4050000001518be;
                      value_4.data_.n = (Number)0xf;
                      pGVar5 = &discardRectangles;
                      pVVar9 = &value_4;
                    }
                    goto LAB_0010c3f0;
                  }
                  value.data_.n = (Number)0x0;
                  value.data_.s.str = (Ch *)0x3000000000000;
                  view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
                  view_masks.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>
                            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)name,(StringRefType *)&view_masks,create_info->sType,alloc);
                  locations.data_.n = (Number)anon_var_dwarf_3e432;
                  locations.data_._8_4_ = 0x14;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkSampleCountFlagBits>
                            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)name,(StringRefType *)&locations,
                             *(VkSampleCountFlagBits *)&create_info->field_0x14,alloc);
                  value_4.data_._4_1_ = '\0';
                  value_4.data_._5_1_ = '\0';
                  value_4.data_._6_1_ = '\0';
                  value_4.data_._7_1_ = '\0';
                  value_4.data_.s.length = create_info->libraryCount;
                  value_2.data_.s.str = (Ch *)0x405000000151806;
                  value_2.data_.n = (Number)0x27;
                }
LAB_0010ae1f:
                uVar4 = value_4.data_._0_4_;
                goto LAB_0010ae44;
              }
              value_4.data_.n = (Number)0x0;
              value_4.data_.s.str = (Ch *)0x3000000000000;
              value_2.data_.n = (Number)anon_var_dwarf_3e7ae;
              value_2.data_._8_4_ = 5;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<VkStructureType>
                        (&value_4,(StringRefType *)&value_2,create_info->sType,alloc);
              value.data_.n = (Number)anon_var_dwarf_3e6fa;
              value.data_._8_4_ = 0x14;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<VkImageLayout>(&value_4,name,create_info->libraryCount,alloc);
              view_masks.data_.n = (Number)anon_var_dwarf_3e706;
              view_masks.data_._8_4_ = 0x12;
              value_00 = *(VkImageLayout *)&create_info->field_0x14;
              name = (StringRefType *)&view_masks;
            }
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkImageLayout>(&value_4,name,value_00,alloc);
            goto LAB_0010bfa2;
          }
          value.data_.n = (Number)0x0;
          value.data_.s.str = (Ch *)0x3000000000000;
          view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
          view_masks.data_._8_4_ = 5;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkStructureType>
                    ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)name,(StringRefType *)&view_masks,create_info->sType,alloc);
          value_4.data_._4_1_ = '\0';
          value_4.data_._5_1_ = '\0';
          value_4.data_._6_1_ = '\0';
          value_4.data_._7_1_ = '\0';
          value_4.data_.s.length = create_info->libraryCount;
          value_2.data_.s.str = (Ch *)0x4050000001518ea;
          value_2.data_.n = (Number)0x14;
          value_4.data_.s.str =
               (Ch *)((ulong)(-1 < (int)create_info->libraryCount) << 0x35 | 0x1d6000000000000);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)name,&value_2,&value_4,alloc);
          if (create_info->pLibraries != (VkPipeline *)0x0) {
            value_2.data_.n = (Number)0x0;
            value_2.data_.s.str = (Ch *)0x4000000000000;
            if (create_info->libraryCount != 0) {
              uVar6 = 0;
              do {
                uVar4 = *(uint *)((long)create_info->pLibraries + uVar6 * 4);
                value_4.data_._4_1_ = '\0';
                value_4.data_._5_1_ = '\0';
                value_4.data_._6_1_ = '\0';
                value_4.data_._7_1_ = '\0';
                value_4.data_.s.length = uVar4;
                value_4.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar4) << 0x35 | 0x1d6000000000000);
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::PushBack(&value_2,&value_4,alloc);
                uVar6 = uVar6 + 1;
              } while (uVar6 < create_info->libraryCount);
            }
            value_4.data_.s.str = (Ch *)0x405000000151918;
            value_4.data_.n = (Number)0x1b;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&value,&value_4,&value_2,alloc);
          }
          if (*(uint **)(create_info + 1) != (uint *)0x0) {
            uVar4 = **(uint **)(create_info + 1);
            value_4.data_._4_1_ = '\0';
            value_4.data_._5_1_ = '\0';
            value_4.data_._6_1_ = '\0';
            value_4.data_._7_1_ = '\0';
            value_4.data_.s.length = uVar4;
            value_2.data_.s.str = (Ch *)0x405000000151934;
            value_2.data_.n = (Number)0x19;
            value_4.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar4) << 0x35 | 0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&value,&value_2,&value_4,alloc);
          }
          if ((uint *)create_info[1].pNext != (uint *)0x0) {
            uVar4 = *create_info[1].pNext;
            value_4.data_._4_1_ = '\0';
            value_4.data_._5_1_ = '\0';
            value_4.data_._6_1_ = '\0';
            value_4.data_._7_1_ = '\0';
            value_4.data_.s.length = uVar4;
            value_2.data_.s.str = (Ch *)0x40500000015194e;
            value_2.data_.n = (Number)0x1b;
            value_4.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar4) << 0x35 | 0x1d6000000000000);
            pVVar9 = &value_2;
            pGVar5 = &value_4;
            goto LAB_0010c3f0;
          }
        }
        goto LAB_0010c3f8;
      }
      value.data_.n = (Number)0x0;
      value.data_.s.str = (Ch *)0x3000000000000;
      view_masks.data_.n = (Number)anon_var_dwarf_3e7ae;
      view_masks.data_._8_4_ = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkStructureType>(&value,(StringRefType *)&view_masks,create_info->sType,alloc);
      locations.data_.n = (Number)0x0;
      locations.data_.s.str = (Ch *)0x3000000000000;
      value_4.data_._4_1_ = '\0';
      value_4.data_._5_1_ = '\0';
      value_4.data_._6_1_ = '\0';
      value_4.data_._7_1_ = '\0';
      value_4.data_.s.length = *(uint *)&create_info->pLibraries;
      value_2.data_.s.str = (Ch *)0x40500000015125c;
      value_2.data_.n = (Number)0x5;
      value_4.data_.s.str =
           (Ch *)((ulong)(-1 < (int)*(uint *)&create_info->pLibraries) << 0x35 | 0x1d6000000000000);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&locations,&value_2,&value_4,alloc);
      uVar4 = *(uint *)((long)&create_info->pLibraries + 4);
      value_4.data_._4_1_ = '\0';
      value_4.data_._5_1_ = '\0';
      value_4.data_._6_1_ = '\0';
      value_4.data_._7_1_ = '\0';
      value_4.data_.s.length = uVar4;
      value_2.data_.s.str = (Ch *)0x405000000151262;
      value_2.data_.n = (Number)0x6;
      value_4.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar4) << 0x35 | 0x1d6000000000000);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&locations,&value_2,&value_4,alloc);
      value_4.data_.s.str = (Ch *)0x405000000151577;
      value_4.data_.n = (Number)0x1e;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&value,&value_4,&locations,alloc);
      if (*(VkAttachmentReference2 **)&create_info->libraryCount == (VkAttachmentReference2 *)0x0) {
LAB_0010b74a:
        next.data_.n = value.data_.n;
        next.data_.s.str = value.data_.s.str;
        goto LAB_0010c402;
      }
      value_2.data_.n = (Number)0x0;
      value_2.data_.s.str = (Ch *)0x0;
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (*(VkAttachmentReference2 **)&create_info->libraryCount,alloc,&value_2);
      if (bVar2) {
        value_4.data_.s.str = (Ch *)0x405000000151596;
        value_4.data_.n = (Number)0x1d;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&value,&value_4,&value_2,alloc);
        goto LAB_0010b74a;
      }
LAB_0010c431:
      bVar2 = false;
    }
LAB_0010c41d:
  } while (bVar2);
  return create_info == (VkPipelineLibraryCreateInfoKHR *)0x0;
}

Assistant:

static bool pnext_chain_json_value(const void *pNext, Allocator &alloc, Value *out_value,
                                   const DynamicStateInfo *dynamic_state_info)
{
	Value nexts(kArrayType);

	while ((pNext = pnext_chain_skip_ignored_entries(pNext)) != nullptr)
	{
		auto *pin = static_cast<const VkBaseInStructure *>(pNext);
		bool ignored = false;
		Value next;

		switch (pin->sType)
		{
		case VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO:
			if (!json_value(*static_cast<const VkPipelineTessellationDomainOriginStateCreateInfo *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineVertexInputDivisorStateCreateInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineRasterizationDepthClipStateCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineRasterizationStateStreamCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO:
			if (!json_value(*static_cast<const VkRenderPassMultiviewCreateInfo *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineColorBlendAdvancedStateCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineRasterizationConservativeStateCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineRasterizationLineStateCreateInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkMutableDescriptorTypeCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT:
			if (!json_value(*static_cast<const VkAttachmentDescriptionStencilLayout *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT:
			if (!json_value(*static_cast<const VkAttachmentReferenceStencilLayout *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE:
			if (!json_value(*static_cast<const VkSubpassDescriptionDepthStencilResolve *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR:
			if (!json_value(*static_cast<const VkFragmentShadingRateAttachmentInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineRenderingCreateInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineColorWriteCreateInfoEXT *>(pNext), alloc, &next, dynamic_state_info))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineSampleLocationsStateCreateInfoEXT *>(pNext), alloc, &next, dynamic_state_info))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkSamplerCustomBorderColorCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO:
			if (!json_value(*static_cast<const VkSamplerReductionModeCreateInfo *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO:
			if (!json_value(*static_cast<const VkRenderPassInputAttachmentAspectCreateInfo *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineDiscardRectangleStateCreateInfoEXT *>(pNext), alloc, &next, dynamic_state_info))
				return false;
			break;

		case VK_STRUCTURE_TYPE_MEMORY_BARRIER_2_KHR:
			if (!json_value(*static_cast<const VkMemoryBarrier2KHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineFragmentShadingRateStateCreateInfoKHR *>(pNext), alloc, &next, dynamic_state_info))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO:
			if (!json_value(*static_cast<const VkSamplerYcbcrConversionCreateInfo *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkGraphicsPipelineLibraryCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO:
		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT:
			// Ignored.
			ignored = true;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineLibraryCreateInfoKHR *>(pNext), alloc, true, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineViewportDepthClipControlCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineCreateFlags2CreateInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT:
			if (!json_value(*static_cast<const VkRenderPassCreationControlEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkSamplerBorderColorComponentMappingCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT:
			if (!json_value(*static_cast<const VkMultisampledRenderToSingleSampledInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT:
			if (!json_value(*static_cast<const VkDepthBiasRepresentationInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkRenderPassFragmentDensityMapCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT:
			if (!json_value(*static_cast<const VkSampleLocationsInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineRobustnessCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineViewportDepthClampControlCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO_KHR:
			if (!json_value(*static_cast<const VkRenderingAttachmentLocationInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO_KHR:
			if (!json_value(*static_cast<const VkRenderingInputAttachmentIndexInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		default:
			log_error_pnext_chain("Unsupported pNext found, cannot hash sType.", pNext);
			return false;
		}

		if (!ignored)
			nexts.PushBack(next, alloc);
		pNext = pin->pNext;
	}

	*out_value = nexts;
	return true;
}